

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O1

void __thiscall PatchAddGolasHeart::alter_world(PatchAddGolasHeart *this,World *w)

{
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *pmVar1;
  pointer *ppMVar2;
  iterator iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Color CVar9;
  Color CVar10;
  Color CVar11;
  Color CVar12;
  Color CVar13;
  Color CVar14;
  Color CVar15;
  Color CVar16;
  Color CVar17;
  Color CVar18;
  Color CVar19;
  Color CVar20;
  Color CVar21;
  Color CVar22;
  Color CVar23;
  Color CVar24;
  Color CVar25;
  Color CVar26;
  Color CVar27;
  Color CVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  vector<MapConnection,_std::allocator<MapConnection>_> *this_00;
  RandomizerWorld *pRVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  PatchAddGolasHeart *pPVar33;
  undefined2 uVar34;
  undefined2 uVar35;
  uint uVar36;
  MapPalette *palette;
  mapped_type *ppMVar37;
  MapPalette *pMVar38;
  long lVar39;
  MapPalette *palette_00;
  Entity *pEVar40;
  pointer pcVar41;
  Map *pMVar42;
  uint8_t i;
  size_type __dnew;
  size_type __dnew_1;
  Attributes local_2e8;
  vector<MapConnection,_std::allocator<MapConnection>_> *local_298;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *local_290;
  RandomizerWorld *local_288;
  undefined1 local_280 [12];
  bool bStack_274;
  undefined2 uStack_273;
  bool bStack_271;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_270;
  pointer pEStack_260;
  pointer local_258;
  pointer pEStack_250;
  undefined **local_248;
  uint16_t local_240;
  uint8_t local_23e;
  undefined2 local_238;
  bool local_236;
  undefined1 local_230 [12];
  undefined4 uStack_224;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_220;
  pointer pEStack_210;
  pointer local_208;
  pointer pEStack_200;
  undefined **local_1f8;
  uint16_t local_1f0;
  uint8_t local_1ee;
  undefined2 local_1e8;
  bool local_1e6;
  PatchAddGolasHeart *local_1e0;
  Attributes local_1d8;
  Attributes local_188;
  MapPalette *local_138;
  MapPalette *local_130;
  MapPalette *local_128;
  Attributes local_120;
  Attributes local_d0;
  Attributes local_80;
  
  local_1e0 = this;
  palette = (MapPalette *)operator_new(0x34);
  local_2e8.type_id = '1';
  local_2e8.position.x = '\x01';
  pmVar1 = &w->_maps;
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar38 = (*ppMVar37)->_palette;
  (palette->super_array<Color,_13UL>)._M_elems[0xc] =
       (pMVar38->super_array<Color,_13UL>)._M_elems[0xc];
  uVar4 = *(undefined8 *)(pMVar38->super_array<Color,_13UL>)._M_elems;
  uVar5 = *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 2);
  uVar6 = *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 4);
  uVar7 = *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 6);
  uVar8 = *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 8) =
       *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 8);
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 10) = uVar8;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 4) = uVar6;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 6) = uVar7;
  *(undefined8 *)(palette->super_array<Color,_13UL>)._M_elems = uVar4;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 2) = uVar5;
  Color::Color((Color *)&local_2e8,0x80,' ',' ');
  CVar9._b = local_2e8.position.y;
  CVar9._invalid = (bool)local_2e8.position.z;
  CVar9._r = local_2e8.type_id;
  CVar9._g = local_2e8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[1] = CVar9;
  Color::Color((Color *)&local_2e8,0xa0,'@',' ');
  CVar10._b = local_2e8.position.y;
  CVar10._invalid = (bool)local_2e8.position.z;
  CVar10._r = local_2e8.type_id;
  CVar10._g = local_2e8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[2] = CVar10;
  Color::Color((Color *)&local_2e8,0xc0,'`','@');
  CVar11._b = local_2e8.position.y;
  CVar11._invalid = (bool)local_2e8.position.z;
  CVar11._r = local_2e8.type_id;
  CVar11._g = local_2e8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[3] = CVar11;
  Color::Color((Color *)&local_2e8,'`',' ',' ');
  CVar12._b = local_2e8.position.y;
  CVar12._invalid = (bool)local_2e8.position.z;
  CVar12._r = local_2e8.type_id;
  CVar12._g = local_2e8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[5] = CVar12;
  Color::Color((Color *)&local_2e8,'`','@','@');
  CVar13._b = local_2e8.position.y;
  CVar13._invalid = (bool)local_2e8.position.z;
  CVar13._r = local_2e8.type_id;
  CVar13._g = local_2e8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[6] = CVar13;
  Color::Color((Color *)&local_2e8,0xa0,'`','`');
  CVar14._b = local_2e8.position.y;
  CVar14._invalid = (bool)local_2e8.position.z;
  CVar14._r = local_2e8.type_id;
  CVar14._g = local_2e8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[7] = CVar14;
  Color::Color((Color *)&local_2e8,0xa0,'`',' ');
  CVar15._b = local_2e8.position.y;
  CVar15._invalid = (bool)local_2e8.position.z;
  CVar15._r = local_2e8.type_id;
  CVar15._g = local_2e8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[8] = CVar15;
  Color::Color((Color *)&local_2e8,0x80,'\0','\0');
  CVar16._b = local_2e8.position.y;
  CVar16._invalid = (bool)local_2e8.position.z;
  CVar16._r = local_2e8.type_id;
  CVar16._g = local_2e8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[9] = CVar16;
  Color::Color((Color *)&local_2e8,0xe0,'@','@');
  CVar17._b = local_2e8.position.y;
  CVar17._invalid = (bool)local_2e8.position.z;
  CVar17._r = local_2e8.type_id;
  CVar17._g = local_2e8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[10] = CVar17;
  Color::Color((Color *)&local_2e8,0xe0,0x80,0x80);
  CVar18._b = local_2e8.position.y;
  CVar18._invalid = (bool)local_2e8.position.z;
  CVar18._r = local_2e8.type_id;
  CVar18._g = local_2e8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[0xb] = CVar18;
  World::add_map_palette(w,palette);
  local_2e8.type_id = 'V';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  local_288 = (RandomizerWorld *)w;
  pMVar38 = build_greyscale_palette(w,(*ppMVar37)->_palette,1.0);
  local_130 = (MapPalette *)operator_new(0x34);
  (local_130->super_array<Color,_13UL>)._M_elems[0]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[0]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[0]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[0]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[1]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[1]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[1]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[1]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[2]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[2]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[2]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[2]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[3]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[3]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[3]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[3]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[4]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[4]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[4]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[4]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[5]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[5]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[5]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[5]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[6]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[6]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[6]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[6]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[7]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[7]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[7]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[7]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[8]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[8]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[8]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[8]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[9]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[9]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[9]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[9]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[10]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[10]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[10]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[10]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[0xb]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[0xb]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[0xb]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[0xb]._invalid = false;
  (local_130->super_array<Color,_13UL>)._M_elems[0xc]._r = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[0xc]._g = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[0xc]._b = '\0';
  (local_130->super_array<Color,_13UL>)._M_elems[0xc]._invalid = false;
  lVar39 = 3;
  do {
    *(undefined4 *)((long)(local_130->super_array<Color,_13UL>)._M_elems + lVar39 + -3) = 0x1000000;
    lVar39 = lVar39 + 4;
  } while (lVar39 != 0x37);
  lVar39 = 0;
  do {
    uVar36 = (uint)(pMVar38->super_array<Color,_13UL>)._M_elems[lVar39]._b;
    Color::Color((Color *)&local_2e8,
                 (uint8_t)((uint)(pMVar38->super_array<Color,_13UL>)._M_elems[lVar39]._r +
                           (uint)(palette->super_array<Color,_13UL>)._M_elems[lVar39]._r >> 1),
                 (uint8_t)((palette->super_array<Color,_13UL>)._M_elems[lVar39]._g + uVar36 >> 1),
                 (uint8_t)((palette->super_array<Color,_13UL>)._M_elems[lVar39]._b + uVar36 >> 1));
    pRVar30 = local_288;
    CVar19._b = local_2e8.position.y;
    CVar19._invalid = (bool)local_2e8.position.z;
    CVar19._r = local_2e8.type_id;
    CVar19._g = local_2e8.position.x;
    (local_130->super_array<Color,_13UL>)._M_elems[lVar39] = CVar19;
    lVar39 = lVar39 + 1;
  } while (lVar39 != 0xd);
  local_128 = pMVar38;
  World::add_map_palette(&local_288->super_World,local_130);
  local_2e8.type_id = 'o';
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  local_138 = build_greyscale_palette(&pRVar30->super_World,(*ppMVar37)->_palette,0.4);
  local_2e8.type_id = '9';
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42 = *ppMVar37;
  local_2e8.type_id = '\f';
  local_2e8.position.x = '\x02';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_layout = (*ppMVar37)->_layout;
  local_2e8.type_id = '\f';
  local_2e8.position.x = '\x02';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_blockset = (*ppMVar37)->_blockset;
  palette_00 = (MapPalette *)operator_new(0x34);
  local_2e8.type_id = '\f';
  local_2e8.position.x = '\x02';
  local_290 = pmVar1;
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar38 = (*ppMVar37)->_palette;
  (palette_00->super_array<Color,_13UL>)._M_elems[0xc] =
       (pMVar38->super_array<Color,_13UL>)._M_elems[0xc];
  uVar4 = *(undefined8 *)(pMVar38->super_array<Color,_13UL>)._M_elems;
  uVar5 = *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 2);
  uVar6 = *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 4);
  uVar7 = *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 6);
  uVar8 = *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 8) =
       *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 8);
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 10) = uVar8;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 4) = uVar6;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 6) = uVar7;
  *(undefined8 *)(palette_00->super_array<Color,_13UL>)._M_elems = uVar4;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 2) = uVar5;
  Color::Color((Color *)&local_2e8,0x80,'\0','\0');
  CVar20._b = local_2e8.position.y;
  CVar20._invalid = (bool)local_2e8.position.z;
  CVar20._r = local_2e8.type_id;
  CVar20._g = local_2e8.position.x;
  (palette_00->super_array<Color,_13UL>)._M_elems[0] = CVar20;
  Color::Color((Color *)&local_2e8,'@','\0',' ');
  CVar21._b = local_2e8.position.y;
  CVar21._invalid = (bool)local_2e8.position.z;
  CVar21._r = local_2e8.type_id;
  CVar21._g = local_2e8.position.x;
  (palette_00->super_array<Color,_13UL>)._M_elems[3] = CVar21;
  Color::Color((Color *)&local_2e8,0x80,'@','\0');
  CVar22._b = local_2e8.position.y;
  CVar22._invalid = (bool)local_2e8.position.z;
  CVar22._r = local_2e8.type_id;
  CVar22._g = local_2e8.position.x;
  (palette_00->super_array<Color,_13UL>)._M_elems[4] = CVar22;
  Color::Color((Color *)&local_2e8,0xc0,'@','\0');
  CVar23._b = local_2e8.position.y;
  CVar23._invalid = (bool)local_2e8.position.z;
  CVar23._r = local_2e8.type_id;
  CVar23._g = local_2e8.position.x;
  (palette_00->super_array<Color,_13UL>)._M_elems[5] = CVar23;
  Color::Color((Color *)&local_2e8,0xe0,'@','@');
  CVar24._b = local_2e8.position.y;
  CVar24._invalid = (bool)local_2e8.position.z;
  CVar24._r = local_2e8.type_id;
  CVar24._g = local_2e8.position.x;
  (palette_00->super_array<Color,_13UL>)._M_elems[8] = CVar24;
  Color::Color((Color *)&local_2e8,'`','\0','\0');
  CVar25._b = local_2e8.position.y;
  CVar25._invalid = (bool)local_2e8.position.z;
  CVar25._r = local_2e8.type_id;
  CVar25._g = local_2e8.position.x;
  (palette_00->super_array<Color,_13UL>)._M_elems[9] = CVar25;
  Color::Color((Color *)&local_2e8,0x80,' ',' ');
  CVar26._b = local_2e8.position.y;
  CVar26._invalid = (bool)local_2e8.position.z;
  CVar26._r = local_2e8.type_id;
  CVar26._g = local_2e8.position.x;
  (palette_00->super_array<Color,_13UL>)._M_elems[10] = CVar26;
  Color::Color((Color *)&local_2e8,0x80,'@','@');
  CVar27._b = local_2e8.position.y;
  CVar27._invalid = (bool)local_2e8.position.z;
  CVar27._r = local_2e8.type_id;
  CVar27._g = local_2e8.position.x;
  (palette_00->super_array<Color,_13UL>)._M_elems[0xb] = CVar27;
  Color::Color((Color *)&local_2e8,0x80,'`','`');
  CVar28._b = local_2e8.position.y;
  CVar28._invalid = (bool)local_2e8.position.z;
  CVar28._r = local_2e8.type_id;
  CVar28._g = local_2e8.position.x;
  (palette_00->super_array<Color,_13UL>)._M_elems[0xc] = CVar28;
  World::add_map_palette(&pRVar30->super_World,palette_00);
  pMVar42->_palette = palette_00;
  pMVar42->_background_music = '\x14';
  pEVar40 = (Entity *)operator_new(0x58);
  local_2e8.type_id = 'b';
  local_2e8.position.x = ',';
  local_2e8.position.y = '\x14';
  local_2e8.position.z = '\x06';
  local_2e8.behavior_id = 0;
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\0';
  local_2e8.palette = '\0';
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.can_pass_through = false;
  local_2e8.appear_after_player_moved_away = false;
  local_2e8.gravity_immune = false;
  local_2e8.talkable = false;
  local_2e8.dialogue = '\0';
  local_2e8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_2e8.persistence_flag.byte = 0xff;
  local_2e8.persistence_flag.bit = 0xff;
  local_2e8.flag_unknown_2_3 = false;
  local_2e8.flag_unknown_2_4 = false;
  local_2e8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_2e8);
  Map::add_entity(pMVar42,pEVar40);
  pPVar33 = local_1e0;
  if (local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_230[0] = 'b';
  local_230[1] = '+';
  local_230[2] = '\x16';
  local_230[3] = '\x06';
  aStack_220._M_allocated_capacity._2_2_ = 0;
  local_230[4] = false;
  local_230[5] = false;
  local_230[6] = false;
  local_230[7] = '\0';
  local_230[8] = '\0';
  local_230[9] = '\0';
  local_230[10] = false;
  local_230[0xb] = false;
  uStack_224._0_1_ = false;
  uStack_224._1_1_ = false;
  uStack_224._2_1_ = false;
  uStack_224._3_1_ = false;
  aStack_220._M_local_buf[0] = '\0';
  aStack_220._8_8_ = (Entity *)0x0;
  pEStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  pEStack_200 = (pointer)0x0;
  local_1f8 = &PTR_to_json_abi_cxx11__00261860;
  local_1f0 = 0xff;
  local_1ee = 0xff;
  local_1e8._0_1_ = false;
  local_1e8._1_1_ = false;
  local_1e6 = false;
  Entity::Entity(pEVar40,(Attributes *)local_230);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_210 != (pointer)0x0) {
    operator_delete(pEStack_210,(long)pEStack_200 - (long)pEStack_210);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_280[0] = 'b';
  local_280[1] = '+';
  local_280[2] = '\x15';
  local_280[3] = '\b';
  local_280[4] = true;
  aStack_270._M_allocated_capacity._2_2_ = 0;
  local_280[5] = false;
  local_280[6] = false;
  local_280[7] = '\0';
  local_280[8] = '\0';
  local_280[9] = '\0';
  local_280[10] = false;
  local_280[0xb] = false;
  bStack_274 = false;
  uStack_273._0_1_ = false;
  uStack_273._1_1_ = false;
  bStack_271 = false;
  aStack_270._M_local_buf[0] = '\0';
  aStack_270._8_8_ = (Entity *)0x0;
  pEStack_260 = (pointer)0x0;
  local_258 = (pointer)0x0;
  pEStack_250 = (pointer)0x0;
  local_248 = &PTR_to_json_abi_cxx11__00261860;
  local_240 = 0xff;
  local_23e = 0xff;
  local_238._0_1_ = false;
  local_238._1_1_ = false;
  local_236 = false;
  Entity::Entity(pEVar40,(Attributes *)local_280);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_260 != (pointer)0x0) {
    operator_delete(pEStack_260,(long)pEStack_250 - (long)pEStack_260);
  }
  pmVar1 = local_290;
  pPVar33->_room_1 = pMVar42;
  local_2e8.type_id = ':';
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(local_290,(key_type *)&local_2e8);
  pMVar42 = *ppMVar37;
  local_2e8.type_id = 'R';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_layout = (*ppMVar37)->_layout;
  local_2e8.type_id = 'R';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_blockset = (*ppMVar37)->_blockset;
  pMVar42->_palette = palette;
  pMVar42->_background_music = '\x14';
  pEVar40 = (Entity *)operator_new(0x58);
  local_2e8.type_id = 0x9c;
  local_2e8.position.x = '\x19';
  local_2e8.position.y = '\x1c';
  local_2e8.position.z = '\x02';
  local_2e8.position.half_x = true;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\x02';
  local_2e8.palette = '\x01';
  local_2e8.behavior_id = 0;
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.can_pass_through = false;
  local_2e8.appear_after_player_moved_away = false;
  local_2e8.gravity_immune = false;
  local_2e8.talkable = false;
  local_2e8.dialogue = '\0';
  local_2e8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_2e8.persistence_flag.byte = 0xff;
  local_2e8.persistence_flag.bit = 0xff;
  local_2e8.flag_unknown_2_3 = false;
  local_2e8.flag_unknown_2_4 = false;
  local_2e8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_2e8);
  if (local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Map::add_entity(pMVar42,pEVar40);
  local_230._0_8_ = &aStack_220;
  local_280[0] = 0xce;
  local_280[1] = '\0';
  local_280[2] = '\0';
  local_280[3] = '\0';
  local_280[4] = false;
  local_280[5] = false;
  local_280[6] = false;
  local_280[7] = '\0';
  pcVar41 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230
                      ,(size_type *)local_280,0);
  uVar31 = local_280._0_4_;
  local_230._0_4_ = SUB84(pcVar41,0);
  local_230._4_4_ = (undefined4)((ulong)pcVar41 >> 0x20);
  lVar39 = CONCAT17(local_280[7],
                    CONCAT16(local_280[6],
                             CONCAT15(local_280[5],CONCAT14(local_280[4],local_280._0_4_))));
  aStack_220._M_local_buf[0] = (char)local_280._0_4_;
  aStack_220._M_local_buf[1] = SUB41(local_280._0_4_,1);
  aStack_220._M_allocated_capacity._2_2_ = SUB42(local_280._0_4_,2);
  aStack_220._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar39 >> 0x20);
  uVar32 = aStack_220._M_allocated_capacity._4_4_;
  memcpy(pcVar41,
         "Foxy: At long last, you\'ve come!\nYou are inside Gola\'s heart,\nthe source of all its power.\x1e\nWhat you are about to face in\nhere is incredibly powerful,\nbut I have faith in you.\x1e\nGood luck. You will need it.\x03"
         ,0xce);
  pRVar30 = local_288;
  local_230._8_4_ = uVar31;
  pcVar41[lVar39] = '\0';
  uStack_224 = uVar32;
  RandomizerWorld::add_custom_dialogue_raw(local_288,pEVar40,(string *)local_230);
  pPVar33 = local_1e0;
  pmVar1 = local_290;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_230._4_4_,local_230._0_4_) != &aStack_220) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_230._4_4_,local_230._0_4_),
                    CONCAT44(aStack_220._M_allocated_capacity._4_4_,
                             CONCAT22(aStack_220._M_allocated_capacity._2_2_,
                                      CONCAT11(aStack_220._M_local_buf[1],aStack_220._M_local_buf[0]
                                              ))) + 1);
  }
  pPVar33->_room_2 = pMVar42;
  local_298 = &(pRVar30->super_World)._map_connections;
  local_2e8._0_2_ = pPVar33->_room_1->_id;
  local_2e8._6_2_ = pMVar42->_id;
  local_2e8.position.y = '!';
  local_2e8.position.z = '0';
  local_2e8.position.half_x = true;
  local_2e8.palette = '\x19';
  local_2e8.speed = '\"';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x2219;
    (iVar3._M_current)->_pos_y_2 = (char)(0x2219 >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x2219 >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x3021;
    (iVar3._M_current)->_pos_y_1 = (char)(0x3021 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 2;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  local_2e8.type_id = 0xe1;
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42 = *ppMVar37;
  local_2e8.type_id = 'Z';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_layout = (*ppMVar37)->_layout;
  local_2e8.type_id = 'Z';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_blockset = (*ppMVar37)->_blockset;
  pMVar42->_palette = palette;
  pMVar42->_background_music = '\x14';
  local_2e8.palette = 0xce;
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.type_id = 0x80;
  local_2e8.position.x = '\x1b';
  local_2e8.position.y = '&';
  local_2e8.position.z = '\0';
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar42->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2e8);
  pEVar40 = (Entity *)operator_new(0x58);
  local_2e8.type_id = 'h';
  local_2e8.position.x = '\x19';
  local_2e8.position.y = '\x11';
  local_2e8.position.z = '\x02';
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\0';
  local_2e8.palette = '\0';
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.can_pass_through = false;
  local_2e8.appear_after_player_moved_away = false;
  local_2e8.gravity_immune = false;
  local_2e8.talkable = false;
  local_2e8.dialogue = '\0';
  local_2e8.behavior_id = 0x6a;
  local_2e8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_2e8.persistence_flag.byte = 0xff;
  local_2e8.persistence_flag.bit = 0xff;
  local_2e8.flag_unknown_2_3 = false;
  local_2e8.flag_unknown_2_4 = false;
  local_2e8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_2e8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_230[0] = 'Q';
  local_230[1] = '\x19';
  local_230[2] = '\x12';
  local_230[3] = '\x05';
  local_230[4] = true;
  local_230[5] = false;
  local_230[6] = false;
  local_230[7] = '\0';
  aStack_220._M_allocated_capacity._2_2_ = 0;
  local_230[8] = '\x01';
  local_230[9] = '\0';
  local_230[10] = false;
  local_230[0xb] = false;
  uStack_224._0_1_ = false;
  uStack_224._1_1_ = false;
  uStack_224._2_1_ = false;
  uStack_224._3_1_ = false;
  aStack_220._M_local_buf[0] = '\0';
  aStack_220._8_8_ = (Entity *)0x0;
  pEStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  pEStack_200 = (pointer)0x0;
  local_1f8 = &PTR_to_json_abi_cxx11__00261860;
  local_1f0 = 0xff;
  local_1ee = 0xff;
  local_1e8._0_1_ = false;
  local_1e8._1_1_ = false;
  local_1e6 = false;
  Entity::Entity(pEVar40,(Attributes *)local_230);
  pRVar30 = local_288;
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_210 != (pointer)0x0) {
    operator_delete(pEStack_210,(long)pEStack_200 - (long)pEStack_210);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_280[0] = 'g';
  local_280[1] = '\x19';
  local_280[2] = '!';
  local_280[3] = '\x02';
  bStack_274 = false;
  local_280[4] = false;
  local_280[5] = false;
  local_280[6] = false;
  local_280[7] = '\0';
  local_280[8] = '\0';
  local_280[9] = '\0';
  local_280[10] = false;
  local_280[0xb] = false;
  uStack_273._0_1_ = true;
  uStack_273._1_1_ = false;
  bStack_271 = false;
  aStack_270._M_local_buf[0] = '\0';
  aStack_270._M_allocated_capacity._2_2_ = 0x6a;
  aStack_270._8_8_ = (Entity *)0x0;
  pEStack_260 = (pointer)0x0;
  local_258 = (pointer)0x0;
  pEStack_250 = (pointer)0x0;
  local_248 = &PTR_to_json_abi_cxx11__00261860;
  local_240 = 0xff;
  local_23e = 0xff;
  local_238._0_1_ = false;
  local_238._1_1_ = false;
  local_236 = false;
  Entity::Entity(pEVar40,(Attributes *)local_280);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_260 != (pointer)0x0) {
    operator_delete(pEStack_260,(long)pEStack_250 - (long)pEStack_260);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_1d8.type_id = 0xaa;
  local_1d8.position.x = '\x15';
  local_1d8.position.y = '\x19';
  local_1d8.position.z = '\b';
  local_1d8.position.half_x = false;
  local_1d8.position.half_y = false;
  local_1d8.position.half_z = false;
  local_1d8.orientation = '\x01';
  local_1d8.behavior_id = 0;
  local_1d8.palette = '\x01';
  local_1d8.speed = '\0';
  local_1d8.fightable = false;
  local_1d8.liftable = false;
  local_1d8.can_pass_through = false;
  local_1d8.appear_after_player_moved_away = false;
  local_1d8.gravity_immune = false;
  local_1d8.talkable = false;
  local_1d8.dialogue = '\0';
  local_1d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_1d8.persistence_flag.byte = 0xff;
  local_1d8.persistence_flag.bit = 0xff;
  local_1d8.flag_unknown_2_3 = false;
  local_1d8.flag_unknown_2_4 = false;
  local_1d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_1d8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_188.type_id = 0xaa;
  local_188.position.x = '\x1e';
  local_188.position.y = '\x19';
  local_188.position.z = '\b';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = false;
  local_188.orientation = '\x03';
  local_188.palette = '\x01';
  local_188.behavior_id = 0;
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = false;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_188);
  Map::add_entity(pMVar42,pEVar40);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pmVar1 = local_290;
  pPVar33->_room_3 = pMVar42;
  local_2e8._0_2_ = pPVar33->_room_2->_id;
  local_2e8._6_2_ = pMVar42->_id;
  local_2e8.position.y = '\x19';
  local_2e8.position.z = '\x17';
  local_2e8.position.half_x = true;
  local_2e8.palette = '\x19';
  local_2e8.speed = '\"';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x2219;
    (iVar3._M_current)->_pos_y_2 = (char)(0x2219 >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x2219 >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x1719;
    (iVar3._M_current)->_pos_y_1 = (char)(0x1719 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 2;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  local_2e8.type_id = '=';
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42 = *ppMVar37;
  local_2e8.type_id = 'H';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_layout = (*ppMVar37)->_layout;
  local_2e8.type_id = 'H';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_blockset = (*ppMVar37)->_blockset;
  pMVar42->_palette = palette;
  pMVar42->_background_music = '\x14';
  (pMVar42->_visited_flag).bit = '\0';
  (pMVar42->_visited_flag).byte = 0xce;
  local_2e8.palette = 0xce;
  local_2e8.speed = '\0';
  local_2e8.fightable = true;
  local_2e8.liftable = false;
  local_2e8.type_id = 0x80;
  local_2e8.position.x = '\x1b';
  local_2e8.position.y = '&';
  local_2e8.position.z = '\0';
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar42->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2e8);
  pEVar40 = (Entity *)operator_new(0x58);
  local_2e8.type_id = '\x1c';
  local_2e8.position.x = '\x17';
  local_2e8.position.y = '\x13';
  local_2e8.position.z = '\b';
  local_2e8.behavior_id = 0;
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\0';
  local_2e8.palette = '\0';
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.can_pass_through = false;
  local_2e8.appear_after_player_moved_away = false;
  local_2e8.gravity_immune = false;
  local_2e8.talkable = false;
  local_2e8.dialogue = '\0';
  local_2e8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_2e8.persistence_flag.byte = 0xff;
  local_2e8.persistence_flag.bit = 0xff;
  local_2e8.flag_unknown_2_3 = false;
  local_2e8.flag_unknown_2_4 = false;
  local_2e8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_2e8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_230[0] = '\x1c';
  local_230[1] = '\x1f';
  local_230[2] = '\x13';
  local_230[3] = '\b';
  aStack_220._M_allocated_capacity._2_2_ = 0;
  local_230[4] = false;
  local_230[5] = false;
  local_230[6] = false;
  local_230[7] = '\0';
  local_230[8] = '\0';
  local_230[9] = '\0';
  local_230[10] = false;
  local_230[0xb] = false;
  uStack_224._0_1_ = false;
  uStack_224._1_1_ = false;
  uStack_224._2_1_ = false;
  uStack_224._3_1_ = false;
  aStack_220._M_local_buf[0] = '\0';
  aStack_220._8_8_ = (Entity *)0x0;
  pEStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  pEStack_200 = (pointer)0x0;
  local_1f8 = &PTR_to_json_abi_cxx11__00261860;
  local_1f0 = 0xff;
  local_1ee = 0xff;
  local_1e8._0_1_ = false;
  local_1e8._1_1_ = false;
  local_1e6 = false;
  Entity::Entity(pEVar40,(Attributes *)local_230);
  pPVar33 = local_1e0;
  pRVar30 = local_288;
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_210 != (pointer)0x0) {
    operator_delete(pEStack_210,(long)pEStack_200 - (long)pEStack_210);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_280[0] = '\x1c';
  local_280[1] = '\x13';
  local_280[2] = '\x17';
  local_280[3] = '\b';
  aStack_270._M_allocated_capacity._2_2_ = 0;
  local_280[4] = false;
  local_280[5] = false;
  local_280[6] = false;
  local_280[7] = '\0';
  local_280[8] = '\0';
  local_280[9] = '\0';
  local_280[10] = false;
  local_280[0xb] = false;
  bStack_274 = false;
  uStack_273._0_1_ = false;
  uStack_273._1_1_ = false;
  bStack_271 = false;
  aStack_270._M_local_buf[0] = '\0';
  aStack_270._8_8_ = (Entity *)0x0;
  pEStack_260 = (pointer)0x0;
  local_258 = (pointer)0x0;
  pEStack_250 = (pointer)0x0;
  local_248 = &PTR_to_json_abi_cxx11__00261860;
  local_240 = 0xff;
  local_23e = 0xff;
  local_238._0_1_ = false;
  local_238._1_1_ = false;
  local_236 = false;
  Entity::Entity(pEVar40,(Attributes *)local_280);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_260 != (pointer)0x0) {
    operator_delete(pEStack_260,(long)pEStack_250 - (long)pEStack_260);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_1d8.type_id = '\x1c';
  local_1d8.position.x = '\x13';
  local_1d8.position.y = '\x1f';
  local_1d8.position.z = '\b';
  local_1d8.behavior_id = 0;
  local_1d8.position.half_x = false;
  local_1d8.position.half_y = false;
  local_1d8.position.half_z = false;
  local_1d8.orientation = '\0';
  local_1d8.palette = '\0';
  local_1d8.speed = '\0';
  local_1d8.fightable = false;
  local_1d8.liftable = false;
  local_1d8.can_pass_through = false;
  local_1d8.appear_after_player_moved_away = false;
  local_1d8.gravity_immune = false;
  local_1d8.talkable = false;
  local_1d8.dialogue = '\0';
  local_1d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_1d8.persistence_flag.byte = 0xff;
  local_1d8.persistence_flag.bit = 0xff;
  local_1d8.flag_unknown_2_3 = false;
  local_1d8.flag_unknown_2_4 = false;
  local_1d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_1d8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_188.type_id = 'g';
  local_188.position.x = '\x19';
  local_188.position.y = '!';
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.position.z = '\0';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = false;
  local_188.orientation = '\0';
  local_188.palette = '\0';
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.appear_after_player_moved_away = true;
  local_188.gravity_immune = false;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.behavior_id = 0x6a;
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_188);
  Map::add_entity(pMVar42,pEVar40);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_120.type_id = 'g';
  local_120.position.x = '!';
  local_120.position.y = '\x19';
  local_120.position.z = '\0';
  local_120.position.half_x = false;
  local_120.position.half_y = false;
  local_120.position.half_z = false;
  local_120.orientation = '\x01';
  local_120.dialogue = '\0';
  local_120.palette = '\0';
  local_120.speed = '\0';
  local_120.fightable = false;
  local_120.liftable = false;
  local_120.can_pass_through = false;
  local_120.appear_after_player_moved_away = false;
  local_120.gravity_immune = false;
  local_120.talkable = false;
  local_120.behavior_id = 0x6a;
  local_120.entity_to_use_tiles_from = (Entity *)0x0;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_120.persistence_flag.byte = 0xff;
  local_120.persistence_flag.bit = 0xff;
  local_120.flag_unknown_2_3 = false;
  local_120.flag_unknown_2_4 = false;
  local_120.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_120);
  Map::add_entity(pMVar42,pEVar40);
  if (local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_d0.type_id = 'Q';
  local_d0.position.x = ' ';
  local_d0.position.y = '\x19';
  local_d0.position.z = '\x04';
  local_d0.position.half_x = true;
  local_d0.position.half_y = true;
  local_d0.position.half_z = false;
  local_d0.orientation = '\0';
  local_d0.palette = '\x01';
  local_d0.behavior_id = 0;
  local_d0.speed = '\0';
  local_d0.fightable = false;
  local_d0.liftable = false;
  local_d0.can_pass_through = false;
  local_d0.appear_after_player_moved_away = false;
  local_d0.gravity_immune = false;
  local_d0.talkable = false;
  local_d0.dialogue = '\0';
  local_d0.entity_to_use_tiles_from = (Entity *)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_d0.persistence_flag.byte = 0xff;
  local_d0.persistence_flag.bit = 0xff;
  local_d0.flag_unknown_2_3 = false;
  local_d0.flag_unknown_2_4 = false;
  local_d0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_d0);
  Map::add_entity(pMVar42,pEVar40);
  if (local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pmVar1 = local_290;
  pPVar33->_room_4 = pMVar42;
  local_2e8._0_2_ = pPVar33->_room_3->_id;
  local_2e8._6_2_ = pMVar42->_id;
  local_2e8.position.y = '\x19';
  local_2e8.position.z = '\x13';
  local_2e8.position.half_x = true;
  local_2e8.palette = '\x19';
  local_2e8.speed = '\"';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x2219;
    (iVar3._M_current)->_pos_y_2 = (char)(0x2219 >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x2219 >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x1319;
    (iVar3._M_current)->_pos_y_1 = (char)(0x1319 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 2;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  local_2e8.type_id = '>';
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42 = *ppMVar37;
  local_2e8.type_id = '7';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_layout = (*ppMVar37)->_layout;
  local_2e8.type_id = '7';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_blockset = (*ppMVar37)->_blockset;
  pMVar42->_palette = palette;
  pMVar42->_background_music = '\x14';
  (pMVar42->_visited_flag).bit = '\x01';
  (pMVar42->_visited_flag).byte = 0xce;
  local_2e8.palette = 0xce;
  local_2e8.speed = '\0';
  local_2e8.fightable = true;
  local_2e8.liftable = true;
  local_2e8.type_id = 0x80;
  local_2e8.position.x = '\x1b';
  local_2e8.position.y = '&';
  local_2e8.position.z = '\0';
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar42->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2e8);
  pEVar40 = (Entity *)operator_new(0x58);
  local_2e8.type_id = 'U';
  local_2e8.position.x = ' ';
  local_2e8.position.y = '\x13';
  local_2e8.position.z = '\x02';
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\0';
  local_2e8.palette = '\x01';
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.can_pass_through = false;
  local_2e8.appear_after_player_moved_away = false;
  local_2e8.gravity_immune = false;
  local_2e8.talkable = false;
  local_2e8.dialogue = '\0';
  local_2e8.behavior_id = 0xd3;
  local_2e8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_2e8.persistence_flag.byte = 0xff;
  local_2e8.persistence_flag.bit = 0xff;
  local_2e8.flag_unknown_2_3 = false;
  local_2e8.flag_unknown_2_4 = false;
  local_2e8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_2e8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_230[0] = 'g';
  local_230[1] = '\x19';
  local_230[2] = '!';
  local_230[3] = '\x02';
  local_230[4] = false;
  local_230[5] = false;
  local_230[6] = false;
  local_230[7] = '\0';
  local_230[8] = '\0';
  local_230[9] = '\0';
  local_230[10] = false;
  local_230[0xb] = false;
  uStack_224._0_1_ = false;
  uStack_224._1_1_ = false;
  uStack_224._2_1_ = false;
  uStack_224._3_1_ = false;
  aStack_220._M_local_buf[0] = '\0';
  aStack_220._M_allocated_capacity._2_2_ = 0x380;
  aStack_220._8_8_ = (Entity *)0x0;
  pEStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  pEStack_200 = (pointer)0x0;
  local_1f8 = &PTR_to_json_abi_cxx11__00261860;
  local_1f0 = 0xff;
  local_1ee = 0xff;
  local_1e8._0_1_ = false;
  local_1e8._1_1_ = false;
  local_1e6 = false;
  Entity::Entity(pEVar40,(Attributes *)local_230);
  pRVar30 = local_288;
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_210 != (pointer)0x0) {
    operator_delete(pEStack_210,(long)pEStack_200 - (long)pEStack_210);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_280[0] = 'h';
  local_280[1] = '\x11';
  local_280[2] = '\x19';
  local_280[3] = '\x02';
  local_280[4] = false;
  local_280[5] = false;
  local_280[6] = false;
  local_280[7] = '\x01';
  aStack_270._M_local_buf[0] = '\0';
  local_280[8] = '\0';
  local_280[9] = '\0';
  local_280[10] = false;
  local_280[0xb] = false;
  bStack_274 = false;
  uStack_273._0_1_ = false;
  uStack_273._1_1_ = false;
  bStack_271 = false;
  aStack_270._M_allocated_capacity._2_2_ = 0x6a;
  aStack_270._8_8_ = (Entity *)0x0;
  pEStack_260 = (pointer)0x0;
  local_258 = (pointer)0x0;
  pEStack_250 = (pointer)0x0;
  local_248 = &PTR_to_json_abi_cxx11__00261860;
  local_240 = 0xff;
  local_23e = 0xff;
  local_238._0_1_ = false;
  local_238._1_1_ = false;
  local_236 = false;
  Entity::Entity(pEVar40,(Attributes *)local_280);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_260 != (pointer)0x0) {
    operator_delete(pEStack_260,(long)pEStack_250 - (long)pEStack_260);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_1d8.type_id = '(';
  local_1d8.position.x = '\x19';
  local_1d8.position.y = '\x19';
  local_1d8.position.z = '\x03';
  local_1d8.position.half_x = true;
  local_1d8.position.half_y = true;
  local_1d8.behavior_id = 0;
  local_1d8.position.half_z = false;
  local_1d8.orientation = '\0';
  local_1d8.palette = '\0';
  local_1d8.speed = '\0';
  local_1d8.fightable = false;
  local_1d8.liftable = false;
  local_1d8.can_pass_through = false;
  local_1d8.appear_after_player_moved_away = false;
  local_1d8.gravity_immune = false;
  local_1d8.talkable = false;
  local_1d8.dialogue = '\0';
  local_1d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_1d8.persistence_flag.byte = 0xff;
  local_1d8.persistence_flag.bit = 0xff;
  local_1d8.flag_unknown_2_3 = false;
  local_1d8.flag_unknown_2_4 = false;
  local_1d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_1d8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pmVar1 = local_290;
  pPVar33->_room_5 = pMVar42;
  local_2e8._0_2_ = pMVar42->_id;
  local_2e8._6_2_ = pPVar33->_room_4->_id;
  local_2e8.position.y = '\x13';
  local_2e8.position.z = '\x19';
  local_2e8.position.half_x = true;
  local_2e8.palette = '\"';
  local_2e8.speed = '\x19';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x1922;
    (iVar3._M_current)->_pos_y_2 = (char)(0x1922 >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x1922 >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x1913;
    (iVar3._M_current)->_pos_y_1 = (char)(0x1913 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 4;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  local_2e8.type_id = '<';
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42 = *ppMVar37;
  local_2e8.type_id = 'b';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_layout = (*ppMVar37)->_layout;
  local_2e8.type_id = 'b';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_blockset = (*ppMVar37)->_blockset;
  pMVar42->_palette = palette;
  pMVar42->_background_music = '\x14';
  (pMVar42->_visited_flag).byte = 0xce;
  (pMVar42->_visited_flag).bit = '\x02';
  local_2e8.palette = 0xce;
  local_2e8.speed = '\0';
  local_2e8.fightable = true;
  local_2e8.liftable = false;
  local_2e8.type_id = 0x80;
  local_2e8.position.x = '\x1b';
  local_2e8.position.y = '&';
  local_2e8.position.z = '\0';
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar42->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2e8);
  pEVar40 = (Entity *)operator_new(0x58);
  local_2e8.type_id = 0xab;
  local_2e8.position.x = '\x19';
  local_2e8.position.y = '\x1a';
  local_2e8.position.z = '\x02';
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\0';
  local_2e8.palette = '\x01';
  local_2e8.behavior_id = 0;
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.can_pass_through = false;
  local_2e8.appear_after_player_moved_away = false;
  local_2e8.gravity_immune = false;
  local_2e8.talkable = false;
  local_2e8.dialogue = '\0';
  local_2e8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_2e8.persistence_flag.byte = 0xff;
  local_2e8.persistence_flag.bit = 0xff;
  local_2e8.flag_unknown_2_3 = false;
  local_2e8.flag_unknown_2_4 = false;
  local_2e8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_2e8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_230[0] = 'h';
  local_230[1] = '\x11';
  local_230[2] = '\x19';
  local_230[3] = '\x02';
  local_230[4] = false;
  local_230[5] = false;
  local_230[6] = false;
  local_230[7] = '\x01';
  aStack_220._M_allocated_capacity._2_2_ = 0;
  aStack_220._M_local_buf[0] = '\0';
  local_230[8] = '\0';
  local_230[9] = '\0';
  local_230[10] = false;
  local_230[0xb] = false;
  uStack_224._0_1_ = false;
  uStack_224._1_1_ = false;
  uStack_224._2_1_ = false;
  uStack_224._3_1_ = false;
  aStack_220._8_8_ = (Entity *)0x0;
  pEStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  pEStack_200 = (pointer)0x0;
  local_1f8 = &PTR_to_json_abi_cxx11__00261860;
  local_1f0 = 0xff;
  local_1ee = 0xff;
  local_1e8._0_1_ = false;
  local_1e8._1_1_ = false;
  local_1e6 = false;
  Entity::Entity(pEVar40,(Attributes *)local_230);
  pRVar30 = local_288;
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_210 != (pointer)0x0) {
    operator_delete(pEStack_210,(long)pEStack_200 - (long)pEStack_210);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_280[0] = 'h';
  local_280[1] = '\x19';
  local_280[2] = '\x11';
  local_280[3] = '\x02';
  aStack_270._M_allocated_capacity._2_2_ = 0;
  local_280[4] = false;
  local_280[5] = false;
  local_280[6] = false;
  local_280[7] = '\0';
  local_280[8] = '\0';
  local_280[9] = '\0';
  local_280[10] = false;
  local_280[0xb] = false;
  bStack_274 = false;
  uStack_273._0_1_ = false;
  uStack_273._1_1_ = false;
  bStack_271 = false;
  aStack_270._M_local_buf[0] = '\0';
  aStack_270._8_8_ = (Entity *)0x0;
  pEStack_260 = (pointer)0x0;
  local_258 = (pointer)0x0;
  pEStack_250 = (pointer)0x0;
  local_248 = &PTR_to_json_abi_cxx11__00261860;
  local_240 = 0xff;
  local_23e = 0xff;
  local_238._0_1_ = false;
  local_238._1_1_ = false;
  local_236 = false;
  Entity::Entity(pEVar40,(Attributes *)local_280);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_260 != (pointer)0x0) {
    operator_delete(pEStack_260,(long)pEStack_250 - (long)pEStack_260);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_1d8.type_id = 'g';
  local_1d8.position.x = '!';
  local_1d8.position.y = '\x19';
  local_1d8.position.z = '\x02';
  local_1d8.position.half_x = false;
  local_1d8.position.half_y = false;
  local_1d8.position.half_z = false;
  local_1d8.orientation = '\x01';
  local_1d8.dialogue = '\0';
  local_1d8.palette = '\0';
  local_1d8.speed = '\0';
  local_1d8.fightable = false;
  local_1d8.liftable = false;
  local_1d8.can_pass_through = false;
  local_1d8.appear_after_player_moved_away = false;
  local_1d8.gravity_immune = false;
  local_1d8.talkable = false;
  local_1d8.behavior_id = 0x6a;
  local_1d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_1d8.persistence_flag.byte = 0xff;
  local_1d8.persistence_flag.bit = 0xff;
  local_1d8.flag_unknown_2_3 = false;
  local_1d8.flag_unknown_2_4 = false;
  local_1d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_1d8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pmVar1 = local_290;
  pPVar33->_room_6 = pMVar42;
  local_2e8._0_2_ = pMVar42->_id;
  local_2e8._6_2_ = pPVar33->_room_5->_id;
  local_2e8.position.y = '\x19';
  local_2e8.position.z = '\x13';
  local_2e8.position.half_x = true;
  local_2e8.palette = '\x19';
  local_2e8.speed = '\"';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x2219;
    (iVar3._M_current)->_pos_y_2 = (char)(0x2219 >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x2219 >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x1319;
    (iVar3._M_current)->_pos_y_1 = (char)(0x1319 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 2;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_2e8._0_2_ = pPVar33->_room_6->_id;
  local_2e8._6_2_ = pPVar33->_room_2->_id;
  local_2e8.position.y = '\x13';
  local_2e8.position.z = '\x19';
  local_2e8.position.half_x = true;
  local_2e8.palette = '\"';
  local_2e8.speed = '\x19';
  local_2e8.fightable = false;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x1922;
    (iVar3._M_current)->_pos_y_2 = (char)(0x1922 >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x1922 >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x1913;
    (iVar3._M_current)->_pos_y_1 = (char)(0x1913 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 4;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  local_2e8.type_id = 'O';
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42 = *ppMVar37;
  local_2e8.type_id = 'V';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_layout = (*ppMVar37)->_layout;
  local_2e8.type_id = 'V';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_blockset = (*ppMVar37)->_blockset;
  pMVar42->_palette = palette;
  (pMVar42->_visited_flag).byte = 0xce;
  (pMVar42->_visited_flag).bit = '\x03';
  pMVar42->_background_music = '\x0f';
  pEVar40 = (Entity *)operator_new(0x58);
  local_2e8.type_id = 0xa5;
  local_2e8.position.x = '\x19';
  local_2e8.position.y = '\x13';
  local_2e8.position.z = '\x04';
  local_2e8.position.half_x = true;
  local_2e8.position.half_y = true;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\x02';
  local_2e8.behavior_id = 0;
  local_2e8.dialogue = '\0';
  local_2e8.palette = '\0';
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.can_pass_through = false;
  local_2e8.appear_after_player_moved_away = false;
  local_2e8.gravity_immune = false;
  local_2e8.talkable = false;
  local_2e8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_2e8.persistence_flag.byte = 0xff;
  local_2e8.persistence_flag.bit = 0xff;
  local_2e8.flag_unknown_2_3 = false;
  local_2e8.flag_unknown_2_4 = false;
  local_2e8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_2e8);
  if (local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (pEVar40->_attrs).fightable = false;
  (pEVar40->_attrs).behavior_id = 0;
  Map::add_entity(pMVar42,pEVar40);
  pEVar40 = (Entity *)operator_new(0x58);
  local_230[0] = 0x9c;
  local_230[1] = '\x13';
  local_230[2] = '\x1f';
  local_230[3] = '\x02';
  local_230[4] = false;
  local_230[5] = false;
  local_230[6] = false;
  local_230[7] = '\x01';
  aStack_220._M_allocated_capacity._2_2_ = 0;
  local_230[8] = '\x03';
  local_230[9] = '\0';
  local_230[10] = false;
  local_230[0xb] = false;
  uStack_224._0_1_ = false;
  uStack_224._1_1_ = false;
  uStack_224._2_1_ = false;
  uStack_224._3_1_ = false;
  aStack_220._M_local_buf[0] = '\0';
  aStack_220._8_8_ = (Entity *)0x0;
  pEStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  pEStack_200 = (pointer)0x0;
  local_1f8 = &PTR_to_json_abi_cxx11__00261860;
  local_1f0 = 0xff;
  local_1ee = 0xff;
  local_1e8._0_1_ = false;
  local_1e8._1_1_ = false;
  local_1e6 = false;
  Entity::Entity(pEVar40,(Attributes *)local_230);
  if (pEStack_210 != (pointer)0x0) {
    operator_delete(pEStack_210,(long)pEStack_200 - (long)pEStack_210);
  }
  Map::add_entity(pMVar42,pEVar40);
  local_280._0_4_ = SUB84(&aStack_270,0);
  local_280[4] = SUB81((ulong)&aStack_270 >> 0x20,0);
  local_280[5] = SUB81((ulong)&aStack_270 >> 0x28,0);
  local_280[6] = SUB81((ulong)&aStack_270 >> 0x30,0);
  local_280[7] = (uint8_t)((ulong)&aStack_270 >> 0x38);
  local_1d8.type_id = 0xd7;
  local_1d8.position.x = '\0';
  local_1d8.position.y = '\0';
  local_1d8.position.z = '\0';
  local_1d8.position.half_x = false;
  local_1d8.position.half_y = false;
  local_1d8.position.half_z = false;
  local_1d8.orientation = '\0';
  pcVar41 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280
                      ,(size_type *)&local_1d8,0);
  uVar35 = local_1d8._6_2_;
  uVar34 = local_1d8.position._3_2_;
  uVar31 = local_1d8._0_4_;
  local_280._0_4_ = SUB84(pcVar41,0);
  local_280[4] = SUB81((ulong)pcVar41 >> 0x20,0);
  local_280[5] = SUB81((ulong)pcVar41 >> 0x28,0);
  local_280[6] = SUB81((ulong)pcVar41 >> 0x30,0);
  local_280[7] = (uint8_t)((ulong)pcVar41 >> 0x38);
  lVar39 = CONCAT26(local_1d8._6_2_,CONCAT24(local_1d8.position._3_2_,local_1d8._0_4_));
  aStack_270._M_local_buf[0] = local_1d8.type_id;
  aStack_270._M_local_buf[1] = local_1d8.position.x;
  aStack_270._M_allocated_capacity._2_2_ = local_1d8.position._1_2_;
  aStack_270._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar39 >> 0x20);
  memcpy(pcVar41,
         "Foxy: The final challenge is very\nclose, you should take some rest.\x1e\nYou are about to fight the very\nsource of Gola\'s power, what made\nits reign of terror possible.\x1e\nPlease set this island free,\nonce and for all...\x03"
         ,0xd7);
  uVar32 = local_1d8._0_4_;
  pRVar30 = local_288;
  local_1d8.type_id = (uint8_t)uVar31;
  local_1d8.position.x = SUB41(uVar31,1);
  local_1d8.position.y = SUB41(uVar31,2);
  local_1d8.position.z = SUB41(uVar31,3);
  local_280[8] = local_1d8.type_id;
  local_280[9] = local_1d8.position.x;
  local_280[10] = local_1d8.position.y;
  local_280[0xb] = local_1d8.position.z;
  bStack_274 = SUB21(uVar34,0);
  uStack_273 = (undefined2)((ulong)lVar39 >> 0x28);
  bStack_271 = SUB21(uVar35,1);
  pcVar41[lVar39] = '\0';
  local_1d8._0_4_ = uVar32;
  RandomizerWorld::add_custom_dialogue_raw(local_288,pEVar40,(string *)local_280);
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT17(local_280[7],
                        CONCAT16(local_280[6],
                                 CONCAT15(local_280[5],CONCAT14(local_280[4],local_280._0_4_))));
  if (paVar29 != &aStack_270) {
    operator_delete(paVar29,CONCAT44(aStack_270._M_allocated_capacity._4_4_,
                                     CONCAT22(aStack_270._M_allocated_capacity._2_2_,
                                              CONCAT11(aStack_270._M_local_buf[1],
                                                       aStack_270._M_local_buf[0]))) + 1);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_280[0] = 0xc0;
  local_280[1] = '\x15';
  local_280[2] = '\x13';
  local_280[3] = '\x03';
  local_280[4] = false;
  local_280[5] = false;
  local_280[6] = false;
  local_280[7] = '\0';
  local_280[8] = '\x01';
  local_280[9] = '\0';
  local_280[10] = false;
  local_280[0xb] = true;
  bStack_274 = false;
  uStack_273._0_1_ = false;
  uStack_273._1_1_ = false;
  bStack_271 = false;
  aStack_270._M_allocated_capacity._2_2_ = 0;
  aStack_270._M_local_buf[0] = '\0';
  aStack_270._8_8_ = (Entity *)0x0;
  pEStack_260 = (pointer)0x0;
  local_258 = (pointer)0x0;
  pEStack_250 = (pointer)0x0;
  local_248 = &PTR_to_json_abi_cxx11__00261860;
  local_240 = 0xff;
  local_23e = 0xff;
  local_238._0_1_ = false;
  local_238._1_1_ = false;
  local_236 = false;
  Entity::Entity(pEVar40,(Attributes *)local_280);
  pPVar33 = local_1e0;
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_260 != (pointer)0x0) {
    operator_delete(pEStack_260,(long)pEStack_250 - (long)pEStack_260);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_1d8.type_id = 0xc0;
  local_1d8.position.x = '\x1e';
  local_1d8.position.y = '\x13';
  local_1d8.position.z = '\x03';
  local_1d8.position.half_x = false;
  local_1d8.position.half_y = false;
  local_1d8.position.half_z = false;
  local_1d8.orientation = '\0';
  local_1d8.palette = '\x01';
  local_1d8.speed = '\0';
  local_1d8.fightable = false;
  local_1d8.liftable = true;
  local_1d8.can_pass_through = false;
  local_1d8.appear_after_player_moved_away = false;
  local_1d8.gravity_immune = false;
  local_1d8.talkable = false;
  local_1d8.behavior_id = 0;
  local_1d8.dialogue = '\0';
  local_1d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_1d8.persistence_flag.byte = 0xff;
  local_1d8.persistence_flag.bit = 0xff;
  local_1d8.flag_unknown_2_3 = false;
  local_1d8.flag_unknown_2_4 = false;
  local_1d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_1d8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_188.type_id = 0xed;
  local_188.position.x = '\x15';
  local_188.position.y = '\x14';
  local_188.position.z = '\x03';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = false;
  local_188.orientation = '\0';
  local_188.palette = '\x01';
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.liftable = true;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = false;
  local_188.talkable = false;
  local_188.behavior_id = 0;
  local_188.dialogue = '\0';
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_188);
  Map::add_entity(pMVar42,pEVar40);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_120.type_id = 0xed;
  local_120.position.x = '\x1e';
  local_120.position.y = '\x14';
  local_120.position.z = '\x03';
  local_120.position.half_x = false;
  local_120.position.half_y = false;
  local_120.position.half_z = false;
  local_120.orientation = '\0';
  local_120.palette = '\x01';
  local_120.speed = '\0';
  local_120.fightable = false;
  local_120.liftable = true;
  local_120.can_pass_through = false;
  local_120.appear_after_player_moved_away = false;
  local_120.gravity_immune = false;
  local_120.talkable = false;
  local_120.behavior_id = 0;
  local_120.dialogue = '\0';
  local_120.entity_to_use_tiles_from = (Entity *)0x0;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_120.persistence_flag.byte = 0xff;
  local_120.persistence_flag.bit = 0xff;
  local_120.flag_unknown_2_3 = false;
  local_120.flag_unknown_2_4 = false;
  local_120.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_120);
  Map::add_entity(pMVar42,pEVar40);
  if (local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pmVar1 = local_290;
  pPVar33->_room_7 = pMVar42;
  local_2e8._0_2_ = pMVar42->_id;
  local_2e8._6_2_ = pPVar33->_room_6->_id;
  local_2e8.position.y = '\x13';
  local_2e8.position.z = '\x19';
  local_2e8.position.half_x = true;
  local_2e8.palette = '\"';
  local_2e8.speed = '\x19';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x1922;
    (iVar3._M_current)->_pos_y_2 = (char)(0x1922 >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x1922 >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x1913;
    (iVar3._M_current)->_pos_y_1 = (char)(0x1913 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 4;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar42 = (Map *)operator_new(0xe0);
  local_2e8.type_id = 0xb5;
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  Map::Map(pMVar42,*ppMVar37);
  Map::clear_entities(pMVar42);
  pMVar42->_id = 0x330;
  pMVar42->_palette = palette;
  pMVar42->_background_music = '\x14';
  pEVar40 = (Entity *)operator_new(0x58);
  local_2e8.type_id = '\x06';
  local_2e8.position.x = '\x15';
  local_2e8.position.y = '\x15';
  local_2e8.position.z = '\x01';
  local_2e8.behavior_id = 0;
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\0';
  local_2e8.palette = '\0';
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.can_pass_through = false;
  local_2e8.appear_after_player_moved_away = false;
  local_2e8.gravity_immune = false;
  local_2e8.talkable = false;
  local_2e8.dialogue = '\0';
  local_2e8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_2e8.persistence_flag.byte = 0xff;
  local_2e8.persistence_flag.bit = 0xff;
  local_2e8.flag_unknown_2_3 = false;
  local_2e8.flag_unknown_2_4 = false;
  local_2e8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_2e8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_230[0] = '\x06';
  local_230[1] = '\x15';
  local_230[2] = '\x10';
  local_230[3] = '\x01';
  aStack_220._M_allocated_capacity._2_2_ = 0;
  local_230[4] = false;
  local_230[5] = false;
  local_230[6] = false;
  local_230[7] = '\0';
  local_230[8] = '\0';
  local_230[9] = '\0';
  local_230[10] = false;
  local_230[0xb] = false;
  uStack_224._0_1_ = false;
  uStack_224._1_1_ = false;
  uStack_224._2_1_ = false;
  uStack_224._3_1_ = false;
  aStack_220._M_local_buf[0] = '\0';
  aStack_220._8_8_ = (Entity *)0x0;
  pEStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  pEStack_200 = (pointer)0x0;
  local_1f8 = &PTR_to_json_abi_cxx11__00261860;
  local_1f0 = 0xff;
  local_1ee = 0xff;
  local_1e8._0_1_ = false;
  local_1e8._1_1_ = false;
  local_1e6 = false;
  Entity::Entity(pEVar40,(Attributes *)local_230);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_210 != (pointer)0x0) {
    operator_delete(pEStack_210,(long)pEStack_200 - (long)pEStack_210);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_280[0] = '\x06';
  local_280[1] = '\x10';
  local_280[2] = '\x10';
  local_280[3] = '\x01';
  aStack_270._M_allocated_capacity._2_2_ = 0;
  local_280[4] = false;
  local_280[5] = false;
  local_280[6] = false;
  local_280[7] = '\0';
  local_280[8] = '\0';
  local_280[9] = '\0';
  local_280[10] = false;
  local_280[0xb] = false;
  bStack_274 = false;
  uStack_273._0_1_ = false;
  uStack_273._1_1_ = false;
  bStack_271 = false;
  aStack_270._M_local_buf[0] = '\0';
  aStack_270._8_8_ = (Entity *)0x0;
  pEStack_260 = (pointer)0x0;
  local_258 = (pointer)0x0;
  pEStack_250 = (pointer)0x0;
  local_248 = &PTR_to_json_abi_cxx11__00261860;
  local_240 = 0xff;
  local_23e = 0xff;
  local_238._0_1_ = false;
  local_238._1_1_ = false;
  local_236 = false;
  Entity::Entity(pEVar40,(Attributes *)local_280);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_260 != (pointer)0x0) {
    operator_delete(pEStack_260,(long)pEStack_250 - (long)pEStack_260);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_1d8.type_id = 'g';
  local_1d8.position.x = '\x1a';
  local_1d8.position.y = '\x12';
  local_1d8.position.z = '\x01';
  local_1d8.position.half_x = false;
  local_1d8.position.half_y = false;
  local_1d8.position.half_z = false;
  local_1d8.orientation = '\x01';
  local_1d8.can_pass_through = false;
  local_1d8.palette = '\0';
  local_1d8.speed = '\0';
  local_1d8.fightable = false;
  local_1d8.liftable = false;
  local_1d8.appear_after_player_moved_away = true;
  local_1d8.gravity_immune = false;
  local_1d8.talkable = false;
  local_1d8.dialogue = '\0';
  local_1d8.behavior_id = 0x311;
  local_1d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_1d8.persistence_flag.byte = 0xff;
  local_1d8.persistence_flag.bit = 0xff;
  local_1d8.flag_unknown_2_3 = false;
  local_1d8.flag_unknown_2_4 = false;
  local_1d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_1d8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_188.type_id = 'r';
  local_188.position.x = '\x12';
  local_188.position.y = '\x13';
  local_188.position.z = '\0';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = true;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.orientation = '\0';
  local_188.palette = '\0';
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = false;
  local_188.behavior_id = 0x6a;
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_188);
  Map::add_entity(pMVar42,pEVar40);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_120.type_id = 'r';
  local_120.position.x = '\x13';
  local_120.position.y = '\x13';
  local_120.position.z = '\0';
  local_120.position.half_x = false;
  local_120.position.half_y = false;
  local_120.position.half_z = true;
  local_120.talkable = false;
  local_120.dialogue = '\0';
  local_120.orientation = '\0';
  local_120.palette = '\0';
  local_120.speed = '\0';
  local_120.fightable = false;
  local_120.liftable = false;
  local_120.can_pass_through = false;
  local_120.appear_after_player_moved_away = false;
  local_120.gravity_immune = false;
  local_120.behavior_id = 0x6a;
  local_120.entity_to_use_tiles_from = (Entity *)0x0;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_120.persistence_flag.byte = 0xff;
  local_120.persistence_flag.bit = 0xff;
  local_120.flag_unknown_2_3 = false;
  local_120.flag_unknown_2_4 = false;
  local_120.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_120);
  Map::add_entity(pMVar42,pEVar40);
  if (local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  World::add_map(&pRVar30->super_World,pMVar42);
  pmVar1 = local_290;
  pPVar33->_room_8 = pMVar42;
  local_2e8._0_2_ = pPVar33->_room_2->_id;
  local_2e8._6_2_ = pMVar42->_id;
  local_2e8.position.y = '\x13';
  local_2e8.position.z = '\x19';
  local_2e8.position.half_x = true;
  local_2e8.palette = '\x1b';
  local_2e8.speed = '\x12';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x121b;
    (iVar3._M_current)->_pos_y_2 = (char)(0x121b >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x121b >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x1913;
    (iVar3._M_current)->_pos_y_1 = (char)(0x1913 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 4;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  local_2e8.type_id = 0x95;
  local_2e8.position.x = '\x02';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42 = *ppMVar37;
  local_2e8.type_id = 0xaf;
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_layout = (*ppMVar37)->_layout;
  local_2e8.type_id = 0xaf;
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  pMVar42->_blockset = (*ppMVar37)->_blockset;
  pMVar42->_palette = palette;
  pMVar42->_background_music = '\x14';
  pEVar40 = (Entity *)operator_new(0x58);
  local_2e8.type_id = 'h';
  local_2e8.position.x = '\x1f';
  local_2e8.position.y = '\x11';
  local_2e8.position.z = '\a';
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\x02';
  local_2e8.behavior_id = 0;
  local_2e8.dialogue = '\0';
  local_2e8.palette = '\0';
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.can_pass_through = false;
  local_2e8.appear_after_player_moved_away = false;
  local_2e8.gravity_immune = false;
  local_2e8.talkable = false;
  local_2e8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_2e8.persistence_flag.byte = 0xff;
  local_2e8.persistence_flag.bit = 0xff;
  local_2e8.flag_unknown_2_3 = false;
  local_2e8.flag_unknown_2_4 = false;
  local_2e8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_2e8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_230[0] = 'J';
  local_230[1] = '\x1b';
  local_230[2] = '!';
  local_230[3] = '\x01';
  local_230[4] = false;
  local_230[5] = false;
  local_230[6] = true;
  local_230[7] = '\0';
  local_230[8] = '\0';
  local_230[9] = '\x03';
  local_230[10] = true;
  local_230[0xb] = false;
  uStack_224._0_1_ = false;
  uStack_224._1_1_ = false;
  uStack_224._2_1_ = true;
  uStack_224._3_1_ = false;
  aStack_220._M_local_buf[0] = '\0';
  aStack_220._M_allocated_capacity._2_2_ = 0x173;
  local_208 = (pointer)0x0;
  pEStack_200 = (pointer)0x0;
  aStack_220._8_8_ = (Entity *)0x0;
  pEStack_210 = (pointer)0x0;
  local_1f8 = &PTR_to_json_abi_cxx11__00261860;
  local_1f0 = 0xff;
  local_1ee = 0xff;
  local_1e8._0_1_ = false;
  local_1e8._1_1_ = false;
  local_1e6 = false;
  Entity::Entity(pEVar40,(Attributes *)local_230);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_210 != (pointer)0x0) {
    operator_delete(pEStack_210,(long)pEStack_200 - (long)pEStack_210);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_280[0] = 'J';
  local_280[1] = '\x1f';
  local_280[2] = '!';
  local_280[3] = '\x01';
  local_280[4] = false;
  local_280[5] = false;
  local_280[6] = true;
  local_280[7] = '\0';
  local_280[8] = '\0';
  local_280[9] = '\x03';
  local_280[10] = true;
  local_280[0xb] = false;
  bStack_274 = false;
  uStack_273._0_1_ = false;
  uStack_273._1_1_ = true;
  bStack_271 = false;
  aStack_270._M_local_buf[0] = '\0';
  aStack_270._M_allocated_capacity._2_2_ = 0x173;
  local_258 = (pointer)0x0;
  pEStack_250 = (pointer)0x0;
  aStack_270._8_8_ = (Entity *)0x0;
  pEStack_260 = (pointer)0x0;
  local_248 = &PTR_to_json_abi_cxx11__00261860;
  local_240 = 0xff;
  local_23e = 0xff;
  local_238._0_1_ = false;
  local_238._1_1_ = false;
  local_236 = false;
  Entity::Entity(pEVar40,(Attributes *)local_280);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_260 != (pointer)0x0) {
    operator_delete(pEStack_260,(long)pEStack_250 - (long)pEStack_260);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_1d8.type_id = 'J';
  local_1d8.position.x = '\x1d';
  local_1d8.position.y = '0';
  local_1d8.position.z = '\x01';
  local_1d8.position.half_x = false;
  local_1d8.position.half_y = false;
  local_1d8.position.half_z = false;
  local_1d8.orientation = '\0';
  local_1d8.palette = '\0';
  local_1d8.speed = '\x03';
  local_1d8.fightable = true;
  local_1d8.liftable = false;
  local_1d8.can_pass_through = false;
  local_1d8.appear_after_player_moved_away = false;
  local_1d8.gravity_immune = true;
  local_1d8.talkable = false;
  local_1d8.dialogue = '\0';
  local_1d8.behavior_id = 0x173;
  local_1d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_1d8.persistence_flag.byte = 0xff;
  local_1d8.persistence_flag.bit = 0xff;
  local_1d8.flag_unknown_2_3 = false;
  local_1d8.flag_unknown_2_4 = false;
  local_1d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_1d8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_188.type_id = 'J';
  local_188.position.x = '\x1c';
  local_188.position.y = '3';
  local_188.position.z = '\x02';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = false;
  local_188.orientation = '\0';
  local_188.palette = '\0';
  local_188.speed = '\x04';
  local_188.fightable = true;
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = true;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.behavior_id = 0x4a;
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_188);
  Map::add_entity(pMVar42,pEVar40);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_120.type_id = 'J';
  local_120.position.x = '\x16';
  local_120.position.y = '3';
  local_120.position.z = '\x02';
  local_120.position.half_x = false;
  local_120.position.half_y = false;
  local_120.position.half_z = true;
  local_120.orientation = '\0';
  local_120.palette = '\0';
  local_120.speed = '\x04';
  local_120.fightable = true;
  local_120.liftable = false;
  local_120.can_pass_through = false;
  local_120.appear_after_player_moved_away = false;
  local_120.gravity_immune = true;
  local_120.talkable = false;
  local_120.dialogue = '\0';
  local_120.behavior_id = 0x4a;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.entity_to_use_tiles_from = (Entity *)0x0;
  local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_120.persistence_flag.byte = 0xff;
  local_120.persistence_flag.bit = 0xff;
  local_120.flag_unknown_2_3 = false;
  local_120.flag_unknown_2_4 = false;
  local_120.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_120);
  Map::add_entity(pMVar42,pEVar40);
  if (local_120.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_d0.type_id = 'J';
  local_d0.position.x = '\x10';
  local_d0.position.y = '3';
  local_d0.position.z = '\x02';
  local_d0.position.half_x = false;
  local_d0.position.half_y = false;
  local_d0.position.half_z = false;
  local_d0.orientation = '\0';
  local_d0.palette = '\0';
  local_d0.speed = '\x04';
  local_d0.fightable = true;
  local_d0.liftable = false;
  local_d0.can_pass_through = false;
  local_d0.appear_after_player_moved_away = false;
  local_d0.gravity_immune = true;
  local_d0.talkable = false;
  local_d0.dialogue = '\0';
  local_d0.behavior_id = 0x4a;
  local_d0.entity_to_use_tiles_from = (Entity *)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_d0.persistence_flag.byte = 0xff;
  local_d0.persistence_flag.bit = 0xff;
  local_d0.flag_unknown_2_3 = false;
  local_d0.flag_unknown_2_4 = false;
  local_d0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_d0);
  Map::add_entity(pMVar42,pEVar40);
  if (local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_80.type_id = 'J';
  local_80.position.x = '\x1f';
  local_80.position.y = '%';
  local_80.position.z = '\x02';
  local_80.position.half_x = false;
  local_80.position.half_y = false;
  local_80.position.half_z = false;
  local_80.orientation = '\0';
  local_80.palette = '\0';
  local_80.speed = '\x04';
  local_80.fightable = true;
  local_80.liftable = false;
  local_80.can_pass_through = false;
  local_80.appear_after_player_moved_away = false;
  local_80.gravity_immune = true;
  local_80.talkable = false;
  local_80.dialogue = '\0';
  local_80.behavior_id = 0x4a;
  local_80.entity_to_use_tiles_from = (Entity *)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_80.persistence_flag.byte = 0xff;
  local_80.persistence_flag.bit = 0xff;
  local_80.flag_unknown_2_3 = false;
  local_80.flag_unknown_2_4 = false;
  local_80.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_80);
  Map::add_entity(pMVar42,pEVar40);
  pRVar30 = local_288;
  if (local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pMVar38 = local_128;
  pmVar1 = local_290;
  pPVar33->_room_9 = pMVar42;
  local_2e8._0_2_ = pMVar42->_id;
  local_2e8._6_2_ = pPVar33->_room_8->_id;
  local_2e8.position.y = '\x1f';
  local_2e8.position.z = '\x12';
  local_2e8.position.half_x = true;
  local_2e8.palette = '\x12';
  local_2e8.speed = '\x13';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x1312;
    (iVar3._M_current)->_pos_y_2 = (char)(0x1312 >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x1312 >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x121f;
    (iVar3._M_current)->_pos_y_1 = (char)(0x121f >> 8);
    (iVar3._M_current)->_extra_byte_1 = 10;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar42 = add_gh_stairs_room(pRVar30,palette,0x331);
  this_00 = local_298;
  pPVar33->_room_10 = pMVar42;
  local_2e8._0_2_ = pPVar33->_room_9->_id;
  local_2e8._6_2_ = pMVar42->_id;
  local_2e8.position.y = '\x10';
  local_2e8.position.z = '3';
  local_2e8.position.half_x = true;
  local_2e8.palette = '-';
  local_2e8.speed = '\x16';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x162d;
    (iVar3._M_current)->_pos_y_2 = (char)(0x162d >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x162d >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x3310;
    (iVar3._M_current)->_pos_y_1 = (char)(0x3310 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 4;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar42 = add_gh_stairs_room(pRVar30,local_130,0x332);
  pPVar33->_room_11 = pMVar42;
  local_2e8._0_2_ = pPVar33->_room_10->_id;
  local_2e8._6_2_ = pMVar42->_id;
  local_2e8.position.y = '\x14';
  local_2e8.position.z = '\x16';
  local_2e8.position.half_x = true;
  local_2e8.palette = '-';
  local_2e8.speed = '\x16';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (this_00,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x162d;
    (iVar3._M_current)->_pos_y_2 = (char)(0x162d >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x162d >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x1614;
    (iVar3._M_current)->_pos_y_1 = (char)(0x1614 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 4;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar42 = add_gh_stairs_room(pRVar30,pMVar38,0x333);
  pPVar33->_room_12 = pMVar42;
  local_2e8._0_2_ = pPVar33->_room_11->_id;
  local_2e8._6_2_ = pMVar42->_id;
  local_2e8.position.y = '\x14';
  local_2e8.position.z = '\x16';
  local_2e8.position.half_x = true;
  local_2e8.palette = '-';
  local_2e8.speed = '\x16';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (this_00,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x162d;
    (iVar3._M_current)->_pos_y_2 = (char)(0x162d >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x162d >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x1614;
    (iVar3._M_current)->_pos_y_1 = (char)(0x1614 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 4;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar42 = (Map *)operator_new(0xe0);
  local_2e8.type_id = '@';
  local_2e8.position.x = '\x01';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  Map::Map(pMVar42,*ppMVar37);
  Map::clear_entities(pMVar42);
  pMVar42->_id = 0x334;
  pMVar42->_palette = pMVar38;
  pMVar42->_background_music = '\x12';
  pEVar40 = (Entity *)operator_new(0x58);
  local_2e8.type_id = 'h';
  local_2e8.position.x = '\x11';
  local_2e8.position.y = '\x19';
  local_2e8.position.z = '\x02';
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\x01';
  local_2e8.behavior_id = 0;
  local_2e8.dialogue = '\0';
  local_2e8.palette = '\0';
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.can_pass_through = false;
  local_2e8.appear_after_player_moved_away = false;
  local_2e8.gravity_immune = false;
  local_2e8.talkable = false;
  local_2e8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_2e8.persistence_flag.byte = 0xff;
  local_2e8.persistence_flag.bit = 0xff;
  local_2e8.flag_unknown_2_3 = false;
  local_2e8.flag_unknown_2_4 = false;
  local_2e8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_2e8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_230[0] = 'h';
  local_230[1] = '\x19';
  local_230[2] = '\x11';
  local_230[3] = '\x02';
  aStack_220._M_allocated_capacity._2_2_ = 0;
  local_230[4] = false;
  local_230[5] = false;
  local_230[6] = false;
  local_230[7] = '\0';
  local_230[8] = '\0';
  local_230[9] = '\0';
  local_230[10] = false;
  local_230[0xb] = false;
  uStack_224._0_1_ = false;
  uStack_224._1_1_ = false;
  uStack_224._2_1_ = false;
  uStack_224._3_1_ = false;
  aStack_220._M_local_buf[0] = '\0';
  aStack_220._8_8_ = (Entity *)0x0;
  pEStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  pEStack_200 = (pointer)0x0;
  local_1f8 = &PTR_to_json_abi_cxx11__00261860;
  local_1f0 = 0xff;
  local_1ee = 0xff;
  local_1e8._0_1_ = false;
  local_1e8._1_1_ = false;
  local_1e6 = false;
  Entity::Entity(pEVar40,(Attributes *)local_230);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_210 != (pointer)0x0) {
    operator_delete(pEStack_210,(long)pEStack_200 - (long)pEStack_210);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_280[0] = '\\';
  local_280[1] = '\x19';
  local_280[2] = '\x19';
  local_280[3] = '\0';
  local_280[4] = false;
  local_280[5] = false;
  local_280[6] = true;
  bStack_271 = false;
  aStack_270._M_local_buf[0] = '\0';
  local_280[7] = '\0';
  local_280[8] = '\0';
  local_280[9] = '\0';
  local_280[10] = false;
  local_280[0xb] = false;
  bStack_274 = false;
  uStack_273._0_1_ = false;
  uStack_273._1_1_ = false;
  aStack_270._M_allocated_capacity._2_2_ = 0x46;
  aStack_270._8_8_ = (Entity *)0x0;
  pEStack_260 = (pointer)0x0;
  local_258 = (pointer)0x0;
  pEStack_250 = (pointer)0x0;
  local_248 = &PTR_to_json_abi_cxx11__00261860;
  local_240 = 0xff;
  local_23e = 0xff;
  local_238._0_1_ = false;
  local_238._1_1_ = false;
  local_236 = false;
  Entity::Entity(pEVar40,(Attributes *)local_280);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_260 != (pointer)0x0) {
    operator_delete(pEStack_260,(long)pEStack_250 - (long)pEStack_260);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_1d8.type_id = 'd';
  local_1d8.position.x = '\x16';
  local_1d8.position.y = '\x19';
  local_1d8.position.z = '\x02';
  local_1d8.position.half_x = false;
  local_1d8.position.half_y = true;
  local_1d8.position.half_z = false;
  local_1d8.orientation = '\x01';
  local_1d8.behavior_id = 0;
  local_1d8.dialogue = '\0';
  local_1d8.palette = '\0';
  local_1d8.speed = '\0';
  local_1d8.fightable = false;
  local_1d8.liftable = false;
  local_1d8.can_pass_through = false;
  local_1d8.appear_after_player_moved_away = false;
  local_1d8.gravity_immune = false;
  local_1d8.talkable = false;
  local_1d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_1d8.persistence_flag.byte = 0xff;
  local_1d8.persistence_flag.bit = 0xff;
  local_1d8.flag_unknown_2_3 = false;
  local_1d8.flag_unknown_2_4 = false;
  local_1d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_1d8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  World::add_map(&pRVar30->super_World,pMVar42);
  pmVar1 = local_290;
  pPVar33->_room_13 = pMVar42;
  local_2e8._0_2_ = pPVar33->_room_12->_id;
  local_2e8._6_2_ = pMVar42->_id;
  local_2e8.position.y = '\x14';
  local_2e8.position.z = '\x16';
  local_2e8.position.half_x = true;
  local_2e8.palette = '\"';
  local_2e8.speed = '\x19';
  local_2e8.fightable = false;
  iVar3._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (this_00,iVar3,(MapConnection *)&local_2e8);
  }
  else {
    (iVar3._M_current)->_pos_x_2 = (char)0x1922;
    (iVar3._M_current)->_pos_y_2 = (char)(0x1922 >> 8);
    (iVar3._M_current)->_extra_byte_2 = (char)(0x1922 >> 0x10);
    (iVar3._M_current)->field_0xb = local_2e8.liftable;
    (iVar3._M_current)->_map_id_1 = local_2e8._0_2_;
    (iVar3._M_current)->_pos_x_1 = (char)0x1614;
    (iVar3._M_current)->_pos_y_1 = (char)(0x1614 >> 8);
    (iVar3._M_current)->_extra_byte_1 = 4;
    (iVar3._M_current)->field_0x5 = local_2e8.position.half_y;
    (iVar3._M_current)->_map_id_2 = local_2e8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar42 = (Map *)operator_new(0xe0);
  local_2e8.type_id = 'o';
  local_2e8.position.x = '\0';
  ppMVar37 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2e8);
  Map::Map(pMVar42,*ppMVar37);
  Map::clear_entities(pMVar42);
  pMVar42->_id = 0x335;
  pMVar42->_palette = local_138;
  pMVar42->_background_music = '\x15';
  pEVar40 = (Entity *)operator_new(0x58);
  local_2e8.type_id = 0xa5;
  local_2e8.position.x = '\x1d';
  local_2e8.position.y = '\x16';
  local_2e8.position.z = '\x04';
  local_2e8.position.half_x = false;
  local_2e8.position.half_y = false;
  local_2e8.position.half_z = false;
  local_2e8.orientation = '\x02';
  local_2e8.palette = '\x01';
  local_2e8.behavior_id = 0;
  local_2e8.speed = '\0';
  local_2e8.fightable = false;
  local_2e8.liftable = false;
  local_2e8.can_pass_through = false;
  local_2e8.appear_after_player_moved_away = false;
  local_2e8.gravity_immune = false;
  local_2e8.talkable = false;
  local_2e8.dialogue = '\0';
  local_2e8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_2e8.persistence_flag.byte = 0xff;
  local_2e8.persistence_flag.bit = 0xff;
  local_2e8.flag_unknown_2_3 = false;
  local_2e8.flag_unknown_2_4 = false;
  local_2e8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_2e8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_2e8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_230[0] = 'I';
  local_230[1] = '\x1a';
  local_230[2] = '\x1e';
  local_230[3] = '\x04';
  local_230[4] = false;
  local_230[5] = false;
  local_230[6] = false;
  local_230[7] = '\0';
  local_230[8] = '\x01';
  local_230[9] = '\x04';
  local_230[10] = true;
  local_230[0xb] = false;
  uStack_224._0_1_ = false;
  uStack_224._1_1_ = false;
  uStack_224._2_1_ = true;
  uStack_224._3_1_ = false;
  aStack_220._M_local_buf[0] = '\0';
  aStack_220._M_allocated_capacity._2_2_ = 0x173;
  aStack_220._8_8_ = (Entity *)0x0;
  pEStack_210 = (pointer)0x0;
  local_208 = (pointer)0x0;
  pEStack_200 = (pointer)0x0;
  local_1f8 = &PTR_to_json_abi_cxx11__00261860;
  local_1f0 = 0xff;
  local_1ee = 0xff;
  local_1e8._0_1_ = false;
  local_1e8._1_1_ = false;
  local_1e6 = false;
  Entity::Entity(pEVar40,(Attributes *)local_230);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_210 != (pointer)0x0) {
    operator_delete(pEStack_210,(long)pEStack_200 - (long)pEStack_210);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_280[0] = 'Q';
  local_280[1] = '\x1d';
  local_280[2] = '\"';
  local_280[3] = '\x05';
  local_280[4] = false;
  local_280[5] = false;
  local_280[6] = true;
  local_280[7] = '\0';
  aStack_270._M_allocated_capacity._2_2_ = 0;
  local_280[8] = '\x01';
  local_280[9] = '\0';
  local_280[10] = false;
  local_280[0xb] = false;
  bStack_274 = false;
  uStack_273._0_1_ = false;
  uStack_273._1_1_ = false;
  bStack_271 = false;
  aStack_270._M_local_buf[0] = '\0';
  aStack_270._8_8_ = (Entity *)0x0;
  pEStack_260 = (pointer)0x0;
  local_258 = (pointer)0x0;
  pEStack_250 = (pointer)0x0;
  local_248 = &PTR_to_json_abi_cxx11__00261860;
  local_240 = 0xff;
  local_23e = 0xff;
  local_238._0_1_ = false;
  local_238._1_1_ = false;
  local_236 = false;
  Entity::Entity(pEVar40,(Attributes *)local_280);
  Map::add_entity(pMVar42,pEVar40);
  if (pEStack_260 != (pointer)0x0) {
    operator_delete(pEStack_260,(long)pEStack_250 - (long)pEStack_260);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_1d8.type_id = 'Q';
  local_1d8.position.x = '\x1e';
  local_1d8.position.y = '\"';
  local_1d8.position.z = '\x05';
  local_1d8.position.half_x = false;
  local_1d8.position.half_y = false;
  local_1d8.position.half_z = true;
  local_1d8.orientation = '\0';
  local_1d8.behavior_id = 0;
  local_1d8.palette = '\x01';
  local_1d8.speed = '\0';
  local_1d8.fightable = false;
  local_1d8.liftable = false;
  local_1d8.can_pass_through = false;
  local_1d8.appear_after_player_moved_away = false;
  local_1d8.gravity_immune = false;
  local_1d8.talkable = false;
  local_1d8.dialogue = '\0';
  local_1d8.entity_to_use_tiles_from = (Entity *)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_1d8.persistence_flag.byte = 0xff;
  local_1d8.persistence_flag.bit = 0xff;
  local_1d8.flag_unknown_2_3 = false;
  local_1d8.flag_unknown_2_4 = false;
  local_1d8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_1d8);
  Map::add_entity(pMVar42,pEVar40);
  if (local_1d8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar40 = (Entity *)operator_new(0x58);
  local_188.type_id = 'Q';
  local_188.position.x = '\x1f';
  local_188.position.y = '\"';
  local_188.position.z = '\x05';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = true;
  local_188.orientation = '\0';
  local_188.palette = '\x01';
  local_188.behavior_id = 0;
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = false;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar40,&local_188);
  Map::add_entity(pMVar42,pEVar40);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  World::add_map(&pRVar30->super_World,pMVar42);
  pPVar33->_room_14 = pMVar42;
  pPVar33->_room_13->_fall_destination = pMVar42->_id;
  return;
}

Assistant:

void PatchAddGolasHeart::alter_world(World& w)
{
    RandomizerWorld& world = reinterpret_cast<RandomizerWorld&>(w);

    MapPalette* golas_heart_palette = build_golas_heart_palette(world);
    MapPalette* stairs_palette_2 = build_greyscale_palette(world, world.map(MAP_LAKE_SHRINE_342)->palette());
    MapPalette* stairs_palette_1 = build_transition_palette(world, golas_heart_palette, stairs_palette_2);
    MapPalette* final_fight_palette = build_greyscale_palette(world, world.map(MAP_NOLE_ARENA)->palette(), 0.4);

    _room_1 = add_gh_room_1(world);

    // Archway
    _room_2 = add_gh_room_2(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_1->id(), 33, 48, _room_2->id(), 25, 34, 2));

    // Double red spinner room
    _room_3 = add_gh_room_3(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_2->id(), 25, 23, _room_3->id(), 25, 34, 2));

    // Lizards room
    _room_4 = add_gh_room_4(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_3->id(), 25, 19, _room_4->id(), 25, 34, 2));

    // Solo unicorn room
    _room_5 = add_gh_room_5(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_5->id(), 19, 25, _room_4->id(), 34, 25, 4));

    // Mirrors T-room
    _room_6 = add_gh_room_6(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_6->id(), 25, 19, _room_5->id(), 25, 34, 2));
    world.map_connections().emplace_back(MapConnection(_room_6->id(), 19, 25, _room_2->id(), 34, 25, 4));

    // Healing room
    _room_7 = add_gh_room_7(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_7->id(), 19, 25, _room_6->id(), 34, 25, 4));

    // WS orc arena
    _room_8 = add_gh_room_8(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_2->id(), 19, 25, _room_8->id(), 27, 18, 4));

    // WS underground
    _room_9 = add_gh_room_9(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_9->id(), 31, 18, _room_8->id(), 18, 19, 10));

    // Giant stairs
    _room_10 = add_gh_stairs_room(world, golas_heart_palette, MAP_GOLAS_HEART_STAIRS_1);
    world.map_connections().emplace_back(MapConnection(_room_9->id(), 16, 51, _room_10->id(), 45, 22, 4));
    _room_11 = add_gh_stairs_room(world, stairs_palette_1, MAP_GOLAS_HEART_STAIRS_2);
    world.map_connections().emplace_back(MapConnection(_room_10->id(), 20, 22, _room_11->id(), 45, 22, 4));
    _room_12 = add_gh_stairs_room(world, stairs_palette_2, MAP_GOLAS_HEART_STAIRS_3);
    world.map_connections().emplace_back(MapConnection(_room_11->id(), 20, 22, _room_12->id(), 45, 22, 4));

    // Falling room
    _room_13 = add_gh_falling_room(world, stairs_palette_2);
    world.map_connections().emplace_back(MapConnection(_room_12->id(), 20, 22, _room_13->id(), 34, 25, 4));

    // Dark Nole room
    _room_14 = add_gh_final_fight_room(world, final_fight_palette);
    _room_13->fall_destination(_room_14->id());
}